

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_send_vzmpv(telnet_t *telnet,__va_list_tag *va)

{
  uint uVar1;
  undefined8 *local_38;
  char *arg;
  __va_list_tag *va_local;
  telnet_t *telnet_local;
  
  telnet_begin_sb(telnet,']');
  while( true ) {
    uVar1 = va->gp_offset;
    if (uVar1 < 0x29) {
      local_38 = (undefined8 *)((long)(int)uVar1 + (long)va->reg_save_area);
      va->gp_offset = uVar1 + 8;
    }
    else {
      local_38 = (undefined8 *)va->overflow_arg_area;
      va->overflow_arg_area = local_38 + 1;
    }
    if ((char *)*local_38 == (char *)0x0) break;
    telnet_zmp_arg(telnet,(char *)*local_38);
  }
  telnet_iac(telnet,0xf0);
  return;
}

Assistant:

void telnet_send_vzmpv(telnet_t *telnet, va_list va) {
	const char* arg;

	/* ZMP header */
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);

	/* send out each argument, including trailing NUL byte */
	while ((arg = va_arg(va, const char *)) != 0)
		telnet_zmp_arg(telnet, arg);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}